

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

void __thiscall flow::IRHandler::dump(IRHandler *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  BasicBlock *this_00;
  undefined8 uVar4;
  reference this_01;
  pointer this_02;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *bb;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *__range1;
  IRHandler *this_local;
  
  Value::name_abi_cxx11_((Value *)this);
  uVar3 = std::__cxx11::string::c_str();
  Value::name_abi_cxx11_((Value *)this);
  iVar2 = std::__cxx11::string::size();
  this_00 = getEntryBlock(this);
  Value::name_abi_cxx11_(&this_00->super_Value);
  uVar4 = std::__cxx11::string::c_str();
  printf(".handler %s %*c; entryPoint = %%%s\n",uVar3,(ulong)(10 - iVar2),0x20,uVar4);
  __end1 = std::__cxx11::
           list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ::begin(&this->blocks_);
  bb = (unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::end(&this->blocks_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) break;
    this_01 = std::
              _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
              ::operator*(&__end1);
    this_02 = std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::operator->
                        (this_01);
    BasicBlock::dump(this_02);
    std::_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
    ::operator++(&__end1);
  }
  printf("\n");
  return;
}

Assistant:

void IRHandler::dump() {
  printf(".handler %s %*c; entryPoint = %%%s\n", name().c_str(),
         10 - (int)name().size(), ' ', getEntryBlock()->name().c_str());

  for (auto& bb : blocks_)
    bb->dump();

  printf("\n");
}